

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O0

int mbedtls_md_hmac(mbedtls_md_info_t *md_info,uchar *key,size_t keylen,uchar *input,size_t ilen,
                   uchar *output)

{
  size_t in_RCX;
  uchar *in_RDX;
  mbedtls_md_context_t *in_RSI;
  long in_RDI;
  int ret;
  mbedtls_md_context_t ctx;
  uint in_stack_ffffffffffffffa8;
  int hmac;
  mbedtls_md_context_t *in_stack_ffffffffffffffb0;
  mbedtls_md_context_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  hmac = -0x6e;
  if (in_RDI == 0) {
    local_4 = -0x5100;
  }
  else {
    mbedtls_md_init((mbedtls_md_context_t *)0x272b9c9);
    local_4 = mbedtls_md_setup(in_stack_ffffffffffffffb8,
                               (mbedtls_md_info_t *)in_stack_ffffffffffffffb0,hmac);
    if (((local_4 == 0) && (local_4 = mbedtls_md_hmac_starts(in_RSI,in_RDX,in_RCX), local_4 == 0))
       && (local_4 = mbedtls_md_hmac_update
                               (in_stack_ffffffffffffffb8,(uchar *)in_stack_ffffffffffffffb0,
                                (ulong)in_stack_ffffffffffffffa8), local_4 == 0)) {
      local_4 = mbedtls_md_hmac_finish(in_RSI,in_RDX);
    }
    mbedtls_md_free(in_stack_ffffffffffffffb0);
  }
  return local_4;
}

Assistant:

int mbedtls_md_hmac(const mbedtls_md_info_t *md_info,
                    const unsigned char *key, size_t keylen,
                    const unsigned char *input, size_t ilen,
                    unsigned char *output)
{
    mbedtls_md_context_t ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (md_info == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    mbedtls_md_init(&ctx);

    if ((ret = mbedtls_md_setup(&ctx, md_info, 1)) != 0) {
        goto cleanup;
    }

    if ((ret = mbedtls_md_hmac_starts(&ctx, key, keylen)) != 0) {
        goto cleanup;
    }
    if ((ret = mbedtls_md_hmac_update(&ctx, input, ilen)) != 0) {
        goto cleanup;
    }
    if ((ret = mbedtls_md_hmac_finish(&ctx, output)) != 0) {
        goto cleanup;
    }

cleanup:
    mbedtls_md_free(&ctx);

    return ret;
}